

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secondaryinstancewidget.cpp
# Opt level: O0

void __thiscall
SecondaryInstanceWidget::SecondaryInstanceWidget
          (SecondaryInstanceWidget *this,KDSingleApplication *kdsa,QWidget *parent)

{
  QLabel *pQVar1;
  QLineEdit *pQVar2;
  QPushButton *pQVar3;
  QGridLayout *pQVar4;
  ConnectionType type;
  Object local_120 [8];
  code *local_118;
  undefined8 local_110;
  QPushButton *local_108;
  Object local_100 [8];
  code *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  undefined8 local_e0;
  Object local_d8 [12];
  QFlags<Qt::AlignmentFlag> local_cc;
  QFlags<Qt::AlignmentFlag> local_c8;
  QFlags<Qt::AlignmentFlag> local_c4;
  QGridLayout *local_c0;
  QGridLayout *layout;
  QString local_b0;
  QPushButton *local_98;
  QPushButton *sendButton;
  undefined1 local_75;
  QFlags<Qt::WindowType> local_74;
  QString local_70;
  QLabel *local_58;
  QLabel *label;
  QString local_40;
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  KDSingleApplication *kdsa_local;
  SecondaryInstanceWidget *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)kdsa;
  kdsa_local = (KDSingleApplication *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_0010bb00;
  *(undefined ***)&this->field_0x10 = &PTR__SecondaryInstanceWidget_0010bcb0;
  this->m_kdsa = (KDSingleApplication *)parent_local;
  this->m_messageEdit = (QLineEdit *)0x0;
  tr(&local_40,"Secondary instance",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QString::~QString(&local_40);
  pQVar1 = (QLabel *)operator_new(0x28);
  local_75 = 1;
  tr(&local_70,"<b>Secondary instance.</b> Send message to primary:",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_74);
  QLabel::QLabel(pQVar1,&local_70,(QWidget *)0x0,(QFlags *)(ulong)local_74.i);
  local_75 = 0;
  QString::~QString(&local_70);
  local_58 = pQVar1;
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,(QWidget *)0x0);
  this->m_messageEdit = pQVar2;
  pQVar2 = this->m_messageEdit;
  tr((QString *)&sendButton,"Type something here...",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar2);
  QString::~QString((QString *)&sendButton);
  pQVar3 = (QPushButton *)operator_new(0x28);
  layout._7_1_ = 1;
  tr(&local_b0,"&Send",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar3,&local_b0,(QWidget *)0x0);
  layout._7_1_ = 0;
  QString::~QString(&local_b0);
  local_98 = pQVar3;
  pQVar4 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar4,(QWidget *)0x0);
  pQVar1 = local_58;
  local_c0 = pQVar4;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c4);
  QGridLayout::addWidget((QWidget *)pQVar4,(int)pQVar1,0,0,1,(QFlags *)0x2);
  pQVar4 = local_c0;
  pQVar2 = this->m_messageEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c8);
  QGridLayout::addWidget((QWidget *)pQVar4,(int)pQVar2,1,(QFlags *)0x0);
  pQVar3 = local_98;
  pQVar4 = local_c0;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_cc);
  QGridLayout::addWidget((QWidget *)pQVar4,(int)pQVar3,1,(QFlags *)0x1);
  QWidget::setLayout((QLayout *)this);
  local_e8 = QLineEdit::returnPressed;
  local_e0 = 0;
  local_f8 = sendMessage;
  uStack_f0 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QLineEdit::*)(),void(SecondaryInstanceWidget::*)()>
            (local_d8,(offset_in_QLineEdit_to_subr)this->m_messageEdit,
             (Object *)QLineEdit::returnPressed,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  local_108 = local_98;
  local_118 = QLineEdit::textChanged;
  local_110 = 0;
  QObject::
  connect<void(QLineEdit::*)(QString_const&),SecondaryInstanceWidget::SecondaryInstanceWidget(KDSingleApplication*,QWidget*)::__0>
            (local_100,(offset_in_QLineEdit_to_subr)this->m_messageEdit,
             (QObject *)QLineEdit::textChanged,(anon_class_8_1_9d6d6698_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  QObject::connect<void(QAbstractButton::*)(bool),void(SecondaryInstanceWidget::*)()>
            (local_120,(offset_in_QAbstractButton_to_subr)local_98,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_120);
  return;
}

Assistant:

SecondaryInstanceWidget::SecondaryInstanceWidget(KDSingleApplication *kdsa, QWidget *parent)
    : QWidget(parent)
    , m_kdsa(kdsa)
{
    setWindowTitle(tr("Secondary instance"));
    QLabel *label = new QLabel(tr("<b>Secondary instance.</b> Send message to primary:"));
    m_messageEdit = new QLineEdit;
    m_messageEdit->setPlaceholderText(tr("Type something here..."));

    QPushButton *sendButton = new QPushButton(tr("&Send"));

    QGridLayout *layout = new QGridLayout;
    layout->addWidget(label, 0, 0, 1, 2);
    layout->addWidget(m_messageEdit, 1, 0);
    layout->addWidget(sendButton, 1, 1);

    setLayout(layout);

    connect(m_messageEdit, &QLineEdit::returnPressed, this, &SecondaryInstanceWidget::sendMessage);
    connect(m_messageEdit, &QLineEdit::textChanged,
            this, [sendButton](const QString &text) { sendButton->setEnabled(!text.isEmpty()); });
    connect(sendButton, &QPushButton::clicked, this, &SecondaryInstanceWidget::sendMessage);
}